

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O0

void __thiscall egc::Sequencer::INCR(Sequencer *this,unsigned_short instruction)

{
  ushort address;
  unsigned_short a;
  pair<unsigned_short,_unsigned_short> pVar1;
  ostream *poVar2;
  element_type *peVar3;
  unsigned_short local_1c;
  unsigned_short local_16;
  unsigned_short sign;
  unsigned_short mk;
  unsigned_short k;
  unsigned_short instruction_local;
  Sequencer *this_local;
  
  address = instruction & 0x3ff;
  poVar2 = std::operator<<((ostream *)&std::cout,"INCR");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::oct);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,address);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  peVar3 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  a = Memory::Read(peVar3,address,0);
  if (a == 0x7fff) {
    local_16 = 1;
  }
  else {
    pVar1 = AddWords(a,1);
    local_1c = pVar1.first;
    local_16 = local_1c;
  }
  peVar3 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  Memory::Write(peVar3,address,local_16);
  return;
}

Assistant:

void egc::Sequencer::INCR (unsigned short instruction)
{
    unsigned short k = instruction & 001777u;

    std::cout << "INCR" << " " << std::oct << k << std::dec << std::endl;

    auto mk = m_Memory->Read(k);

    unsigned short sign = mk & 040000u;

    if (mk == 077777u)
    {
        mk = 000001u;
    }
    else
    {
        mk = AddWords(mk, 000001u).first;
    }

    m_Memory->Write(k, mk);
}